

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::
TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::
update(TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
       *this)

{
  iterator iVar1;
  iterator iVar2;
  TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
  *this_local;
  
  iVar1 = ::std::
          vector<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
          ::begin(&this->_samples);
  iVar2 = ::std::
          vector<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
          ::end(&this->_samples);
  ::std::
  sort<__gnu_cxx::__normal_iterator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>::Sample*,std::vector<tinyusdz::TypedTimeSamples<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>::Sample>>>,tinyusdz::TypedTimeSamples<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>::update()const::_lambda(tinyusdz::TypedTimeSamples<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>::Sample_const&,tinyusdz::TypedTimeSamples<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>::Sample_const&)_1_>
            (iVar1._M_current,iVar2._M_current);
  this->_dirty = false;
  return;
}

Assistant:

void update() const {
    std::sort(_samples.begin(), _samples.end(),
              [](const Sample &a, const Sample &b) { return a.t < b.t; });

    _dirty = false;

    return;
  }